

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_> *node)

{
  pointer *this_00;
  bool bVar1;
  pointer pMVar2;
  unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_> *in_RDX;
  variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  local_120;
  variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  local_110;
  reference local_100;
  variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  *item_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  *__range1_2;
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  new_body;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_c0;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_b8;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_a8;
  reference local_98;
  pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
  *param;
  iterator __end1_1;
  iterator __begin1_1;
  Parameters *__range1_1;
  unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_> local_68;
  value_type local_60;
  reference local_58;
  unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_> *item;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  *__range1;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  new_ports;
  unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_> *node_local;
  Transformer *this_local;
  
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::vector((vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
            *)&__range1);
  pMVar2 = std::unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_>::operator->
                     (in_RDX);
  __end1 = std::
           vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
           ::begin(&pMVar2->ports);
  item = (unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_> *)
         std::
         vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
         ::end(&pMVar2->ports);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>_>
                                *)&item);
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>_>
               ::operator*(&__end1);
    std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>::
    unique_ptr(&local_68,local_58);
    (**(code **)&(node->_M_t).
                 super___uniq_ptr_impl<verilogAST::Module,_std::default_delete<verilogAST::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_verilogAST::Module_*,_std::default_delete<verilogAST::Module>_>
                 .super__Head_base<0UL,_verilogAST::Module_*,_false>._M_head_impl[2].body.
                 super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
                 ._M_impl)(&local_60,node,&local_68);
    std::
    vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
    ::push_back((vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
                 *)&__range1,&local_60);
    std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>::
    ~unique_ptr(&local_60);
    std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>::
    ~unique_ptr(&local_68);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>_>
    ::operator++(&__end1);
  }
  pMVar2 = std::unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_>::operator->
                     (in_RDX);
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::operator=(&pMVar2->ports,
              (vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
               *)&__range1);
  pMVar2 = std::unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_>::operator->
                     (in_RDX);
  __end1_1 = std::
             vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
             ::begin(&pMVar2->parameters);
  param = (pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
           *)std::
             vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
             ::end(&pMVar2->parameters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
                        *)&param);
    if (!bVar1) break;
    local_98 = __gnu_cxx::
               __normal_iterator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
               ::operator*(&__end1_1);
    std::
    variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::variant(&local_b8,&local_98->first);
    (*(code *)(node->_M_t).
              super___uniq_ptr_impl<verilogAST::Module,_std::default_delete<verilogAST::Module>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Module_*,_std::default_delete<verilogAST::Module>_>
              .super__Head_base<0UL,_verilogAST::Module_*,_false>._M_head_impl[1].name.
              _M_string_length)(&local_a8,node,&local_b8);
    std::
    variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::operator=(&local_98->first,&local_a8);
    std::
    variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::~variant(&local_a8);
    std::
    variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::~variant(&local_b8);
    this_00 = &new_body.
               super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    unique_ptr((unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *)
               this_00,&local_98->second);
    (**(code **)(node->_M_t).
                super___uniq_ptr_impl<verilogAST::Module,_std::default_delete<verilogAST::Module>_>.
                _M_t.
                super__Tuple_impl<0UL,_verilogAST::Module_*,_std::default_delete<verilogAST::Module>_>
                .super__Head_base<0UL,_verilogAST::Module_*,_false>._M_head_impl)
              (&local_c0,node,this_00);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
              (&local_98->second,&local_c0);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    ~unique_ptr(&local_c0);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    ~unique_ptr((unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *)
                &new_body.
                 super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ::vector((vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
            *)&__range1_2);
  pMVar2 = std::unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_>::operator->
                     (in_RDX);
  __end1_2 = std::
             vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
             ::begin(&pMVar2->body);
  item_1 = (variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
            *)std::
              vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
              ::end(&pMVar2->body);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_*,_std::vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>_>
                        *)&item_1);
    if (!bVar1) break;
    local_100 = __gnu_cxx::
                __normal_iterator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_*,_std::vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>_>
                ::operator*(&__end1_2);
    std::
    variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
    ::variant(&local_120,local_100);
    visit<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>>
              (&local_110,(Transformer *)node,&local_120);
    std::
    vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
    ::push_back((vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
                 *)&__range1_2,&local_110);
    std::
    variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
    ::~variant(&local_110);
    std::
    variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
    ::~variant(&local_120);
    __gnu_cxx::
    __normal_iterator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_*,_std::vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>_>
    ::operator++(&__end1_2);
  }
  pMVar2 = std::unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_>::operator->
                     (in_RDX);
  std::
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ::operator=(&pMVar2->body,
              (vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
               *)&__range1_2);
  std::unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_>::unique_ptr
            ((unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_> *)this,in_RDX
            );
  std::
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ::~vector((vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
             *)&__range1_2);
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::~vector((vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
             *)&__range1);
  return (__uniq_ptr_data<verilogAST::Module,_std::default_delete<verilogAST::Module>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Module,_std::default_delete<verilogAST::Module>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Module> Transformer::visit(std::unique_ptr<Module> node) {
  std::vector<std::unique_ptr<AbstractPort>> new_ports;
  for (auto&& item : node->ports) {
    new_ports.push_back(this->visit(std::move(item)));
  }
  node->ports = std::move(new_ports);
  for (auto&& param : node->parameters) {
    param.first = this->visit(std::move(param.first));
    param.second = this->visit(std::move(param.second));
  }
  std::vector<std::variant<std::unique_ptr<StructuralStatement>,
                           std::unique_ptr<Declaration>>>
      new_body;
  for (auto&& item : node->body) {
    new_body.push_back(this->visit(std::move(item)));
  }
  node->body = std::move(new_body);
  return node;
}